

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O3

string * __thiscall
inja::Parser::load_file_abi_cxx11_(string *__return_storage_ptr__,Parser *this,string_view filename)

{
  undefined8 uVar1;
  ifstream file;
  string local_238;
  long local_218 [29];
  undefined8 auStack_130 [36];
  
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_238,filename._M_str,filename._M_str + filename._M_len);
  open_file_or_throw((inja *)local_218,&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  uVar1 = *(undefined8 *)((long)auStack_130 + *(long *)(local_218[0] + -0x18));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((string *)__return_storage_ptr__,uVar1,0xffffffff,0,0xffffffff);
  std::ifstream::~ifstream(local_218);
  return __return_storage_ptr__;
}

Assistant:

std::string load_file(nonstd::string_view filename) {
    std::ifstream file = open_file_or_throw(static_cast<std::string>(filename));
    std::string text((std::istreambuf_iterator<char>(file)), std::istreambuf_iterator<char>());
    return text;
  }